

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

BeliefLowerBound * __thiscall
despot::BaseRockSample::CreateBeliefLowerBound(BaseRockSample *this,string *name)

{
  int iVar1;
  BeliefLowerBound *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (BeliefLowerBound *)operator_new(0x10);
    despot::TrivialBeliefLowerBound::TrivialBeliefLowerBound
              ((TrivialBeliefLowerBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(0);
      }
    }
    this_00 = (BeliefLowerBound *)operator_new(0x18);
    despot::BeliefLowerBound::BeliefLowerBound(this_00,(DSPOMDP *)&this->super_BeliefMDP);
    *(undefined ***)this_00 = &PTR__BeliefLowerBound_0011a948;
    *(BaseRockSample **)(this_00 + 0x10) = this;
  }
  return this_00;
}

Assistant:

BeliefLowerBound* BaseRockSample::CreateBeliefLowerBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		return new RockSampleEastBeliefPolicy(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(0);
		return NULL;
	}
}